

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 202_happyNum.cpp
# Opt level: O0

int sqsum(int n)

{
  __type _Var1;
  undefined4 local_10;
  undefined4 local_c;
  int s;
  int n_local;
  
  local_10 = 0;
  for (local_c = n; local_c != 0; local_c = local_c / 10) {
    _Var1 = std::pow<int,int>(local_c % 10,2);
    local_10 = (int)((double)local_10 + _Var1);
  }
  return local_10;
}

Assistant:

int sqsum(int n)
{
    int s = 0;
    while (n)
    {
        s += pow(n%10,2);
        n/=10;
    }
    return s;
}